

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-open.c
# Opt level: O2

void seek_buffer(hd_context *ctx,hd_stream *stm,int64_t offset,int whence)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  
  puVar3 = (uchar *)(long)stm->pos;
  puVar2 = stm->rp + ((long)puVar3 - (long)stm->wp);
  if (whence == 2) {
    offset = (int64_t)(puVar3 + offset);
  }
  else if (whence == 1) {
    offset = (int64_t)(puVar2 + offset);
  }
  puVar1 = (uchar *)0x0;
  if (0 < offset) {
    puVar1 = (uchar *)offset;
  }
  if ((long)puVar3 <= (long)puVar1) {
    puVar1 = puVar3;
  }
  stm->rp = stm->rp + ((int)puVar1 - (int)puVar2);
  return;
}

Assistant:

static void seek_buffer(hd_context *ctx, hd_stream *stm, int64_t offset, int whence)
{
    int64_t pos = stm->pos - (stm->wp - stm->rp);
    /* Convert to absolute pos */
    if (whence == 1)
    {
        offset += pos; /* Was relative to current pos */
    }
    else if (whence == 2)
    {
        offset += stm->pos; /* Was relative to end */
    }

    if (offset < 0)
        offset = 0;
    if (offset > stm->pos)
        offset = stm->pos;
    stm->rp += (int)(offset - pos);
}